

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_45d97::SignalAction::apply_to(SignalAction *this,int signum,bool restart)

{
  int iVar1;
  ContextManager *pCVar2;
  char *pcVar3;
  string local_38;
  byte local_15;
  int local_14;
  bool restart_local;
  SignalAction *pSStack_10;
  int signum_local;
  SignalAction *this_local;
  
  if (restart) {
    (this->sigaction).sa_flags = (this->sigaction).sa_flags | 0x10000000;
  }
  local_15 = restart;
  local_14 = signum;
  pSStack_10 = this;
  iVar1 = sigaction(signum,(sigaction *)this,(sigaction *)0x0);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    pcVar3 = strsignal(local_14);
    format_abi_cxx11_(&local_38,"Cannot set signal action for %s: %m",pcVar3);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_15 & 1) != 0) {
    (this->sigaction).sa_flags = (this->sigaction).sa_flags & 0xefffffff;
  }
  return;
}

Assistant:

void apply_to(int signum, bool restart = false) const {
        if (restart) {
            sigaction.sa_flags |= SA_RESTART;
        }
        if (::sigaction(signum, &sigaction, nullptr)) {
            die(format("Cannot set signal action for %s: %m", strsignal(signum)));
        }
        if (restart) {
            sigaction.sa_flags &= (~SA_RESTART);
        }
    }